

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesDispatch2<false,true>
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  BeagleCPU4StateSSEImpl<double,_2,_0> *in_RDI;
  
  if (in_RCX == (double *)0x0) {
    accumulateDerivativesImpl<false,true,false>(in_RDI,in_RSI,in_RDX,(double *)0x0);
  }
  else {
    accumulateDerivativesImpl<false,true,true>(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return;
}

Assistant:

void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesDispatch2(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumSquaredDerivatives == NULL) {
        accumulateDerivativesImpl<DoDerivatives, DoSum, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesImpl<DoDerivatives, DoSum, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}